

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

string * __thiscall
flatbuffers::java::JavaGenerator::GenOffsetGetter_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,FieldDef *key_field,char *num)

{
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator<char> local_2a;
  undefined1 local_29;
  char *local_28;
  char *num_local;
  FieldDef *key_field_local;
  JavaGenerator *this_local;
  string *key_offset;
  
  local_29 = 0;
  local_28 = num;
  num_local = (char *)key_field;
  key_field_local = (FieldDef *)this;
  this_local = (JavaGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  NumToString<unsigned_short>(&local_a0,*(unsigned_short *)(num_local + 0x108));
  std::operator+(&local_80,"__offset(",&local_a0);
  std::operator+(&local_60,&local_80,", ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  if (local_28 == (char *)0x0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"bb.capacity()");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," - tableOffset, bb)");
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_28);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", _bb)");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenOffsetGetter(flatbuffers::FieldDef *key_field,
                              const char *num = nullptr) const {
    std::string key_offset = "";
    key_offset += "__offset(" + NumToString(key_field->value.offset) + ", ";
    if (num) {
      key_offset += num;
      key_offset += ", _bb)";
    } else {
      key_offset += "bb.capacity()";
      key_offset += " - tableOffset, bb)";
    }
    return key_offset;
  }